

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::Array2D<float>::Array2D(Array2D<float> *this,int nx,int ny,allocator_type allocator)

{
  int iVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  uVar3 = 0;
  TVar2.x = nx >> 0x1f & nx;
  uVar4 = 0;
  if (0 < nx) {
    uVar4 = (ulong)(uint)nx;
  }
  if (0 < ny) {
    uVar3 = (ulong)(uint)ny;
  }
  TVar2.y = ny >> 0x1f & ny;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar2;
  iVar1 = -nx;
  if (0 < nx) {
    iVar1 = nx;
  }
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)(uVar4 | uVar3 << 0x20);
  (this->allocator).memoryResource = allocator.memoryResource;
  iVar5 = -ny;
  if (0 < ny) {
    iVar5 = ny;
  }
  uVar6 = iVar5 * iVar1;
  iVar1 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                    (allocator.memoryResource,(ulong)uVar6 * 4,4);
  this->values = (float *)CONCAT44(extraout_var,iVar1);
  if (uVar6 != 0) {
    memset((float *)CONCAT44(extraout_var,iVar1),0,(ulong)uVar6 << 2);
    return;
  }
  return;
}

Assistant:

Array2D(int nx, int ny, allocator_type allocator = {})
        : Array2D({{0, 0}, {nx, ny}}, allocator) {}